

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O3

bool __thiscall
ON_Curve::EvTangent(ON_Curve *this,double t,ON_3dPoint *point,ON_3dVector *tangent,int side,
                   int *hint)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  ON_Interval domain;
  double tplus;
  double tminus;
  ON_3dVector D2;
  ON_3dVector d1;
  ON_3dVector d2;
  ON_3dPoint p;
  ON_3dVector D1;
  ON_Interval local_e0;
  double local_d0;
  double local_c8;
  ON_3dVector local_c0;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  tangent->z = ON_3dVector::ZeroVector.z;
  dVar6 = ON_3dVector::ZeroVector.y;
  dVar7 = ON_3dVector::ZeroVector.x;
  tangent->x = ON_3dVector::ZeroVector.x;
  tangent->y = dVar6;
  bVar1 = Ev1Der(this,t,point,tangent,side,hint);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_3dVector::Unitize(tangent);
  if (bVar1) {
    return true;
  }
  bVar1 = Ev2Der(this,t,point,&local_48,&local_c0,side,hint);
  if (!bVar1) {
    return true;
  }
  tangent->z = local_c0.z;
  tangent->x = local_c0.x;
  tangent->y = local_c0.y;
  bVar1 = ON_3dVector::Unitize(tangent);
  if (!bVar1) {
    return false;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(this);
  local_c8 = 0.0;
  local_d0 = 0.0;
  local_e0.m_t[1] = dVar7;
  bVar1 = ON_Interval::IsIncreasing(&local_e0);
  if (!bVar1) {
    return true;
  }
  iVar2 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2d])
                    (t,this,&local_c8,&local_d0);
  if ((char)iVar2 == '\0') {
    return true;
  }
  pdVar3 = ON_Interval::operator[](&local_e0,1);
  if ((side < 0) || (*pdVar3 <= t)) {
    pdVar3 = ON_Interval::operator[](&local_e0,0);
    if ((*pdVar3 != t) || (NAN(*pdVar3) || NAN(t))) {
      pdVar3 = ON_Interval::operator[](&local_e0,0);
      if ((-1 < side) || (t < *pdVar3 || t == *pdVar3)) {
        pdVar3 = ON_Interval::operator[](&local_e0,1);
        if ((*pdVar3 != t) || (NAN(*pdVar3) || NAN(t))) {
          dVar7 = 0.0;
          goto LAB_00425710;
        }
      }
      dVar7 = local_c8 - t;
      if (0.0 <= dVar7) {
        return true;
      }
      dVar6 = ON_Interval::ParameterAt(&local_e0,0.9);
      if (dVar7 + t < dVar6) {
        return true;
      }
      goto LAB_00425710;
    }
  }
  dVar7 = local_d0 - t;
  if (dVar7 <= 0.0) {
    return true;
  }
  dVar6 = ON_Interval::ParameterAt(&local_e0,0.1);
  if (dVar6 < dVar7 + t) {
    return true;
  }
LAB_00425710:
  iVar2 = 0;
  iVar4 = 3;
  iVar5 = 0;
  do {
    dVar6 = dVar7 + t;
    if ((((dVar6 == t) && (!NAN(dVar6) && !NAN(t))) ||
        (bVar1 = Ev2Der(this,dVar6,&local_60,&local_a8,&local_78,side,(int *)0x0), !bVar1)) ||
       (dVar6 = ON_3dVector::operator*(&local_a8,&local_78), 0.0 < dVar6)) break;
    iVar5 = iVar5 + (uint)(dVar6 < 0.0);
    iVar2 = iVar2 + (uint)(0.0 <= dVar6);
    dVar7 = dVar7 * 0.5;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  if ((iVar5 != 0) && (iVar2 + iVar5 == 3)) {
    ON_3dVector::operator-(&local_90,tangent);
    tangent->z = local_90.z;
    tangent->x = local_90.x;
    tangent->y = local_90.y;
  }
  return true;
}

Assistant:

bool ON_Curve::EvTangent(
       double t,
       ON_3dPoint& point,
       ON_3dVector& tangent,
       int side,
       int* hint
       ) const
{
  ON_3dVector D1, D2;//, K;
  tangent = ON_3dVector::ZeroVector;
  int rc = Ev1Der( t, point, tangent, side, hint );
  if ( rc && !tangent.Unitize() ) 
  {
    if ( Ev2Der( t, point, D1, D2, side, hint ) )
    {
      // Use l'Hopital's rule to show that if the unit tangent
      // exists, the 1rst derivative is zero, and the 2nd
      // derivative is nonzero, then the unit tangent is equal
      // to +/-the unitized 2nd derivative.  The sign is equal
      // to the sign of D1(s) o D2(s) as s approaches the 
      // evaluation parameter.
      tangent = D2;
      rc = tangent.Unitize();
      if ( rc )
      {
        ON_Interval domain = Domain();
        double tminus = 0.0;
        double tplus = 0.0;
        if ( domain.IsIncreasing() && GetParameterTolerance( t, &tminus, &tplus ) )
        {
          ON_3dPoint p;
          ON_3dVector d1, d2;
          double eps = 0.0;
          double d1od2tol = 0.0; //1.0e-10; // 1e-5 is too big
          double d1od2;
          double tt = t;
          //double dt = 0.0;

          if ( (t < domain[1] && side >= 0) || (t == domain[0]) )
          {
            eps = tplus-t;
            if ( eps <= 0.0 || t+eps > domain.ParameterAt(0.1) )
              return rc;
          }
          else if ( (t > domain[0] && side < 0) || (t == domain[1]) )
          {
            eps = tminus - t;
            if ( eps >= 0.0 || t+eps < domain.ParameterAt(0.9) )
              return rc;
          }

          int i, negative_count=0, zero_count=0;
          int test_count = 3;
          for ( i = 0; i < test_count; i++, eps *= 0.5 )
          {
            tt = t + eps;
            if ( tt == t )
              break;
            if (!Ev2Der( tt, p, d1, d2, side, 0 ))
              break;
            d1od2 = d1*d2;
            if ( d1od2 > d1od2tol )
              break;
            if ( d1od2 < d1od2tol )
              negative_count++;
            else
              zero_count++;
          }
          if ( negative_count > 0 && test_count == negative_count+zero_count )
          {
            // all sampled d1od2 values were <= 0 
            // and at least one was strictly < 0.
            tangent = -tangent;
          }
        }
      }
    }
  }
  return rc;
}